

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonehash.cpp
# Opt level: O0

int __thiscall asmjit::v1_14::ZoneHashBase::_remove(ZoneHashBase *this,char *__filename)

{
  uint32_t uVar1;
  undefined8 *in_RDX;
  ZoneHashNode *p;
  ZoneHashNode **pPrev;
  uint32_t hashMod;
  undefined8 *local_40;
  undefined8 *local_38;
  char *local_20;
  ZoneHashBase *local_18;
  undefined8 *local_10;
  char **local_8;
  
  local_8 = &local_20;
  local_20 = __filename;
  local_18 = this;
  uVar1 = _calcMod(this,*(uint32_t *)(in_RDX + 1));
  local_38 = (undefined8 *)(*(long *)this + (ulong)uVar1 * 8);
  local_40 = (undefined8 *)*local_38;
  do {
    if (local_40 == (undefined8 *)0x0) {
      local_10 = (undefined8 *)0x0;
LAB_0016c37f:
      return (int)local_10;
    }
    if (local_40 == in_RDX) {
      *local_38 = *local_40;
      *(long *)(this + 8) = *(long *)(this + 8) + -1;
      local_10 = in_RDX;
      goto LAB_0016c37f;
    }
    local_38 = local_40;
    local_40 = (undefined8 *)*local_40;
  } while( true );
}

Assistant:

ZoneHashNode* ZoneHashBase::_remove(ZoneAllocator* allocator, ZoneHashNode* node) noexcept {
  DebugUtils::unused(allocator);
  uint32_t hashMod = _calcMod(node->_hashCode);

  ZoneHashNode** pPrev = &_data[hashMod];
  ZoneHashNode* p = *pPrev;

  while (p) {
    if (p == node) {
      *pPrev = p->_hashNext;
      _size--;
      return node;
    }

    pPrev = &p->_hashNext;
    p = *pPrev;
  }

  return nullptr;
}